

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-condvar.c
# Opt level: O2

int run_test_condvar_5(void)

{
  uv_mutex_t *mutex;
  int iVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  undefined8 uVar4;
  char *pcVar5;
  worker_config_conflict wc;
  worker_config_conflict wStack_d8;
  
  worker_config_init(&wStack_d8,0,(signal_func)0x0,(wait_func)0x0);
  mutex = &wStack_d8.mutex;
  uv_mutex_lock(mutex);
  uVar2 = uv_hrtime();
  iVar1 = uv_cond_timedwait(&wStack_d8.cond,mutex,100000000);
  uVar3 = uv_hrtime();
  uv_mutex_unlock(mutex);
  if (iVar1 == -0x6e) {
    if (uVar3 - uVar2 < 75000000) {
      pcVar5 = "0.75 * timeout <= elapsed";
      uVar4 = 0x105;
    }
    else {
      if (uVar3 - uVar2 < 0x1dcd6501) {
        worker_config_destroy(&wStack_d8);
        return 0;
      }
      pcVar5 = "elapsed <= 5.0 * timeout";
      uVar4 = 0x106;
    }
  }
  else {
    pcVar5 = "r == UV_ETIMEDOUT";
    uVar4 = 0xfe;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-condvar.c"
          ,uVar4,pcVar5);
  abort();
}

Assistant:

TEST_IMPL(condvar_5) {
  worker_config wc;
  int r;
  /* ns */
  uint64_t before;
  uint64_t after;
  uint64_t elapsed;
  uint64_t timeout;

  timeout = 100 * 1000 * 1000; /* 100 ms in ns */

  /* Mostly irrelevant. We need cond and mutex initialized. */
  worker_config_init(&wc, 0, NULL, NULL);

  uv_mutex_lock(&wc.mutex);

  /* We wait.
   * No signaler, so this will only return if timeout is delivered. */
  before = uv_hrtime();
  r = uv_cond_timedwait(&wc.cond, &wc.mutex, timeout);
  after = uv_hrtime();

  uv_mutex_unlock(&wc.mutex);

  /* It timed out. */
  ASSERT(r == UV_ETIMEDOUT);

  /* It must have taken at least timeout, modulo system timer ticks.
   * But it should not take too much longer.
   * cf. MSDN docs:
   * https://msdn.microsoft.com/en-us/library/ms687069(VS.85).aspx */
  elapsed = after - before;
  ASSERT(0.75 * timeout <= elapsed); /* 1.0 too large for Windows. */
  ASSERT(elapsed <= 5.0 * timeout); /* MacOS has reported failures up to 1.75. */

  worker_config_destroy(&wc);

  return 0;
}